

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_umax8_m68k(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    bVar3 = *(byte *)((long)b + uVar2);
    if (*(byte *)((long)b + uVar2) < *(byte *)((long)a + uVar2)) {
      bVar3 = *(byte *)((long)a + uVar2);
    }
    *(byte *)((long)d + uVar2) = bVar3;
    uVar2 = uVar2 + 1;
  } while (uVar1 + 8 != uVar2);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_umax8_m68k_cold_1();
  return;
}

Assistant:

void HELPER(gvec_umax8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        uint8_t aa = *(uint8_t *)((char *)a + i);
        uint8_t bb = *(uint8_t *)((char *)b + i);
        uint8_t dd = aa > bb ? aa : bb;
        *(uint8_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}